

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setupTest.cpp
# Opt level: O2

void __thiscall MPI_Init_Test::TestBody(MPI_Init_Test *this)

{
  char *message;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertionResult gtest_ar;
  
  local_20.ptr_._0_4_ = MPI_Init(0,0);
  local_28.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"MPI_Init(nullptr, nullptr)","0",(int *)&local_20,
             (int *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/setupTest.cpp"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_20);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(MPI, Init)
{
	EXPECT_EQ(MPI_Init(nullptr, nullptr),MPI_SUCCESS);
}